

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCurrentChar(xmlXPathParserContextPtr ctxt,int *len)

{
  byte bVar1;
  byte *pbVar2;
  xmlChar *cur;
  uint val;
  uchar c;
  int *len_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return 0;
  }
  pbVar2 = ctxt->cur;
  bVar1 = *pbVar2;
  if ((bVar1 & 0x80) == 0) {
    *len = 1;
    return (uint)*pbVar2;
  }
  if ((pbVar2[1] & 0xc0) == 0x80) {
    if ((bVar1 & 0xe0) == 0xe0) {
      if ((pbVar2[2] & 0xc0) != 0x80) goto LAB_00265a22;
      if ((bVar1 & 0xf0) == 0xf0) {
        if (((bVar1 & 0xf8) != 0xf0) || ((pbVar2[3] & 0xc0) != 0x80)) goto LAB_00265a22;
        *len = 4;
        cur._0_4_ = pbVar2[3] & 0x3f |
                    (pbVar2[2] & 0x3f) << 6 | (pbVar2[1] & 0x3f) << 0xc | (*pbVar2 & 7) << 0x12;
      }
      else {
        *len = 3;
        cur._0_4_ = pbVar2[2] & 0x3f | (pbVar2[1] & 0x3f) << 6 | (*pbVar2 & 0xf) << 0xc;
      }
    }
    else {
      *len = 2;
      cur._0_4_ = pbVar2[1] & 0x3f | (*pbVar2 & 0x1f) << 6;
    }
    if ((uint)cur < 0x100) {
      if ((((8 < (uint)cur) && ((uint)cur < 0xb)) || ((uint)cur == 0xd)) || (0x1f < (uint)cur)) {
        return (uint)cur;
      }
    }
    else {
      if ((0xff < (uint)cur) && ((uint)cur < 0xd800)) {
        return (uint)cur;
      }
      if ((0xdfff < (uint)cur) && ((uint)cur < 0xfffe)) {
        return (uint)cur;
      }
      if ((0xffff < (uint)cur) && ((uint)cur < 0x110000)) {
        return (uint)cur;
      }
    }
    xmlXPathErr(ctxt,0x15);
    return 0;
  }
LAB_00265a22:
  *len = 0;
  xmlXPathErr(ctxt,0x14);
  return 0;
}

Assistant:

static int
xmlXPathCurrentChar(xmlXPathParserContextPtr ctxt, int *len) {
    unsigned char c;
    unsigned int val;
    const xmlChar *cur;

    if (ctxt == NULL)
	return(0);
    cur = ctxt->cur;

    /*
     * We are supposed to handle UTF8, check it's valid
     * From rfc2044: encoding of the Unicode values on UTF-8:
     *
     * UCS-4 range (hex.)           UTF-8 octet sequence (binary)
     * 0000 0000-0000 007F   0xxxxxxx
     * 0000 0080-0000 07FF   110xxxxx 10xxxxxx
     * 0000 0800-0000 FFFF   1110xxxx 10xxxxxx 10xxxxxx
     *
     * Check for the 0x110000 limit too
     */
    c = *cur;
    if (c & 0x80) {
	if ((cur[1] & 0xc0) != 0x80)
	    goto encoding_error;
	if ((c & 0xe0) == 0xe0) {

	    if ((cur[2] & 0xc0) != 0x80)
		goto encoding_error;
	    if ((c & 0xf0) == 0xf0) {
		if (((c & 0xf8) != 0xf0) ||
		    ((cur[3] & 0xc0) != 0x80))
		    goto encoding_error;
		/* 4-byte code */
		*len = 4;
		val = (cur[0] & 0x7) << 18;
		val |= (cur[1] & 0x3f) << 12;
		val |= (cur[2] & 0x3f) << 6;
		val |= cur[3] & 0x3f;
	    } else {
	      /* 3-byte code */
		*len = 3;
		val = (cur[0] & 0xf) << 12;
		val |= (cur[1] & 0x3f) << 6;
		val |= cur[2] & 0x3f;
	    }
	} else {
	  /* 2-byte code */
	    *len = 2;
	    val = (cur[0] & 0x1f) << 6;
	    val |= cur[1] & 0x3f;
	}
	if (!IS_CHAR(val)) {
	    XP_ERROR0(XPATH_INVALID_CHAR_ERROR);
	}
	return(val);
    } else {
	/* 1-byte code */
	*len = 1;
	return((int) *cur);
    }
encoding_error:
    /*
     * If we detect an UTF8 error that probably means that the
     * input encoding didn't get properly advertised in the
     * declaration header. Report the error and switch the encoding
     * to ISO-Latin-1 (if you don't like this policy, just declare the
     * encoding !)
     */
    *len = 0;
    XP_ERROR0(XPATH_ENCODING_ERROR);
}